

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

ssize_t __thiscall
anon_unknown.dwarf_3027f24::ReaderSpy::read(ReaderSpy *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pcVar1;
  element_type *peVar2;
  long lVar3;
  undefined4 in_register_00000034;
  char *chars;
  string buf;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  lVar3 = (**(code **)((long)*(this->r).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x20))();
  if (lVar3 != 0) {
    pcVar1 = (this->prefix)._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->prefix)._M_string_length);
    std::__cxx11::string::replace
              ((ulong)&local_48,local_40,(char *)0x0,CONCAT44(in_register_00000034,__fd));
    peVar2 = (this->s).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)((long)*peVar2 + 0x20))(peVar2,local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  return lVar3;
}

Assistant:

size_t read(void* buffer, size_t n) override {
    auto c = r->read(buffer, n);
    if (c > 0) {
      auto chars = reinterpret_cast<const char*>(buffer);
      std::string buf = prefix;
      buf.append(chars, chars + c);
      s->write(buf.data(), buf.size());
    }
    return c;
  }